

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.hpp
# Opt level: O0

uchar * ableton::link::v1::detail::
        encodeMessage<ableton::discovery::Payload<ableton::link::HostTime,ableton::discovery::Payload<ableton::link::PrevGHostTime,ableton::discovery::Payload<>>>,unsigned_char*>
                  (MessageType messageType,
                  Payload<ableton::link::HostTime,_ableton::discovery::Payload<ableton::link::PrevGHostTime,_ableton::discovery::Payload<>_>_>
                  *payload,uchar *out)

{
  uint32_t uVar1;
  size_type sVar2;
  size_t sVar3;
  const_iterator __first;
  const_iterator __last;
  uchar *puVar4;
  range_error *this;
  size_t messageSize;
  uchar *puStack_20;
  MessageHeader header;
  uchar *out_local;
  Payload<ableton::link::HostTime,_ableton::discovery::Payload<ableton::link::PrevGHostTime,_ableton::discovery::Payload<>_>_>
  *payload_local;
  MessageType messageType_local;
  
  messageSize._7_1_ = messageType;
  puStack_20 = out;
  sVar2 = std::array<char,_8UL>::size((array<char,_8UL> *)&kProtocolHeader);
  uVar1 = v1::sizeInByteStream((MessageHeader *)((long)&messageSize + 7));
  sVar3 = discovery::sizeInByteStream(payload);
  if (sVar2 + uVar1 + sVar3 < 0x200) {
    __first = std::begin<std::array<char,8ul>>((array<char,_8UL> *)&kProtocolHeader);
    __last = std::end<std::array<char,8ul>>((array<char,_8UL> *)&kProtocolHeader);
    puVar4 = std::copy<char_const*,unsigned_char*>(__first,__last,puStack_20);
    puVar4 = v1::toNetworkByteStream<unsigned_char*>
                       ((MessageHeader *)((long)&messageSize + 7),puVar4);
    puVar4 = discovery::toNetworkByteStream<unsigned_char*>(payload,puVar4);
    return puVar4;
  }
  this = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this,"Exceeded maximum message size");
  __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

It encodeMessage(const MessageType messageType, const Payload& payload, It out)
{
  using namespace std;
  const MessageHeader header = {messageType};
  const auto messageSize =
    kProtocolHeader.size() + sizeInByteStream(header) + sizeInByteStream(payload);

  if (messageSize < kMaxMessageSize)
  {
    return toNetworkByteStream(
      payload, toNetworkByteStream(
                 header, copy(begin(kProtocolHeader), end(kProtocolHeader), move(out))));
  }
  else
  {
    throw range_error("Exceeded maximum message size");
  }
}